

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall
QHybrid::QHybrid(QHybrid *this,PlanningUnitDecPOMDPDiscrete *pu,Qheur_t QheurTypeFirstTimeSteps,
                QFunctionJointBeliefInterface *QlastTimeSteps,size_t horizonLastTimeSteps)

{
  PlanningUnit *this_00;
  size_t sVar1;
  PlanningUnit *this_01;
  QFunctionForDecPOMDPInterface QVar2;
  undefined8 uVar3;
  QFunctionForDecPOMDPInterface in_RCX;
  undefined4 in_EDX;
  QFunctionForDecPOMDPInterface *in_RDI;
  QFunctionForDecPOMDPInterface in_R8;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff88;
  QTable *in_stack_ffffffffffffff90;
  QFunctionForDecPOMDPInterface *arg;
  
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)in_RDI);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface(in_RDI,&PTR_PTR_00d05dc8);
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            ((QFunctionForDecPOMDP *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
  QFunctionJAOHInterface::QFunctionJAOHInterface((QFunctionJAOHInterface *)in_RDI,&PTR_PTR_00d05d98)
  ;
  *in_RDI = (QFunctionForDecPOMDPInterface)&PTR__QHybrid_00d05c38;
  *in_RDI = (QFunctionForDecPOMDPInterface)&PTR__QHybrid_00d05c38;
  *in_RDI = (QFunctionForDecPOMDPInterface)&PTR__QHybrid_00d05c38;
  in_RDI[0xd] = (QFunctionForDecPOMDPInterface)&PTR__QHybrid_00d05d28;
  QTable::QTable(in_stack_ffffffffffffff90);
  *(undefined4 *)(in_RDI + 7) = in_EDX;
  in_RDI[8] = in_RCX;
  in_RDI[9] = in_R8;
  arg = in_RDI + 10;
  this_00 = (PlanningUnit *)
            (**(code **)(*(long *)(&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x88)) + 0x60))
                      (&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x88));
  sVar1 = PlanningUnit::GetHorizon(this_00);
  *arg = (QFunctionForDecPOMDPInterface)(sVar1 - (long)in_R8);
  *(undefined1 *)(in_RDI + 0xc) = 0;
  in_RDI[0xc].field_0x1 = 0;
  this_01 = (PlanningUnit *)
            (**(code **)(*(long *)(&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x88)) + 0x60))
                      (&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x88));
  QVar2 = (QFunctionForDecPOMDPInterface)PlanningUnit::GetHorizon(this_01);
  if ((ulong)QVar2 <= (ulong)in_R8) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E((E *)this_00,(char *)arg);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

QHybrid::QHybrid(const PlanningUnitDecPOMDPDiscrete* pu,
                 Qheur_t QheurTypeFirstTimeSteps,
                 QFunctionJointBeliefInterface *QlastTimeSteps,
                 size_t horizonLastTimeSteps) : 
    QFunctionForDecPOMDP(pu), //virtual base first
    _m_QheurTypeFirstTS(QheurTypeFirstTimeSteps),
    _m_QlastTimeSteps(QlastTimeSteps),
    _m_horizonLastTimeSteps(horizonLastTimeSteps),
    _m_horizonFirstTimeSteps(GetPU()->GetHorizon()-horizonLastTimeSteps),
    _m_optimizedHorLast(false),
    _m_initialized(false)
{
    if(horizonLastTimeSteps>=GetPU()->GetHorizon())
        throw(E("QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon"));
}